

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-parser.c++
# Opt level: O1

Array<const_char> * __thiscall
capnp::SchemaFile::DiskSchemaFile::readContent
          (Array<const_char> *__return_storage_ptr__,DiskSchemaFile *this)

{
  ReadableFile *pRVar1;
  char *pcVar2;
  size_t sVar3;
  Array<const_char> *result;
  char *local_68;
  size_t sStack_60;
  ArrayDisposer *local_58;
  undefined1 local_48 [8];
  undefined8 local_40;
  
  pRVar1 = (this->file).ptr;
  (*(pRVar1->super_FsNode)._vptr_FsNode[2])(local_48,pRVar1);
  (*(pRVar1->super_FsNode)._vptr_FsNode[7])(&local_68,pRVar1,0,local_40);
  if (local_58 == (ArrayDisposer *)0x0) {
    __return_storage_ptr__->ptr = (char *)0x0;
    __return_storage_ptr__->size_ = 0;
    __return_storage_ptr__->disposer = (ArrayDisposer *)0x0;
  }
  else {
    __return_storage_ptr__->ptr = local_68;
    __return_storage_ptr__->size_ = sStack_60;
    __return_storage_ptr__->disposer = local_58;
    local_68 = (char *)0x0;
    sStack_60 = 0;
  }
  sVar3 = sStack_60;
  pcVar2 = local_68;
  if (local_68 != (char *)0x0) {
    local_68 = (char *)0x0;
    sStack_60 = 0;
    (**local_58->_vptr_ArrayDisposer)(local_58,pcVar2,1,sVar3,sVar3,0);
  }
  return __return_storage_ptr__;
}

Assistant:

kj::Array<const char> readContent() const override {
    return file->mmap(0, file->stat().size).releaseAsChars();
  }